

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String __thiscall doctest::Approx::toString(Approx *this)

{
  long in_RSI;
  String local_48;
  void *local_40;
  String local_38;
  String local_30;
  
  String::String(&local_48,"Approx( ");
  doctest::toString((doctest *)&local_40,*(double *)(in_RSI + 0x10));
  String::operator+(&local_30,&local_48);
  String::String(&local_38," )");
  String::operator+((String *)this,&local_30);
  free(local_38.m_str);
  free(local_30.m_str);
  free(local_40);
  free(local_48.m_str);
  return (String)(char *)this;
}

Assistant:

String Approx::toString() const { return String("Approx( ") + doctest::toString(m_value) + " )"; }